

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

void __thiscall
SList<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount>::Clear
          (SList<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount> *this)

{
  Type pAVar1;
  Type_conflict pSVar2;
  bool bVar3;
  Type_conflict *ppSVar4;
  long *plVar5;
  long extraout_RDX;
  code *local_60;
  SList<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount> *this_local;
  FreeFuncType freeFunc;
  NodeBase *next;
  NodeBase *current;
  
  pAVar1 = this->allocator;
  ppSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next
                      ((SListNodeBase<Memory::ArenaAllocator> *)this);
  next = *ppSVar4;
  while (bVar3 = SListBase<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount>
                 ::IsHead(&this->
                           super_SListBase<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount>
                          ,next), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next(next);
    pSVar2 = *ppSVar4;
    local_60 = (code *)Memory::
                       TypeAllocatorFunc<Memory::ArenaAllocator,_Js::ByteCodeBufferBuilder::AuxRecord>
                       ::GetFreeFunc();
    plVar5 = (long *)((long)&(pAVar1->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ).super_Allocator.outOfMemoryFunc + extraout_RDX);
    if (((ulong)local_60 & 1) != 0) {
      local_60 = *(code **)(local_60 + *plVar5 + -1);
    }
    (*local_60)(plVar5,next,0x10);
    next = pSVar2;
  }
  SListBase<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount>::Reset
            (&this->
              super_SListBase<Js::ByteCodeBufferBuilder::AuxRecord,_Memory::ArenaAllocator,_RealCount>
            );
  return;
}

Assistant:

void Clear()
    {
        __super::Clear(allocator);
    }